

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_tools_enc.c
# Opt level: O2

int SmoothenBlock(uint8_t *a_ptr,int a_stride,uint8_t *y_ptr,int y_stride,int width,int height)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  
  iVar2 = 0;
  uVar4 = 0;
  if (0 < width) {
    uVar4 = (ulong)(uint)width;
  }
  iVar5 = 0;
  if (0 < height) {
    iVar5 = height;
  }
  iVar1 = 0;
  puVar7 = a_ptr;
  puVar8 = y_ptr;
  for (iVar3 = 0; iVar3 != iVar5; iVar3 = iVar3 + 1) {
    for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      if (puVar7[uVar6] != '\0') {
        iVar2 = iVar2 + 1;
        iVar1 = iVar1 + (uint)puVar8[uVar6];
      }
    }
    puVar7 = puVar7 + a_stride;
    puVar8 = puVar8 + y_stride;
  }
  if ((0 < iVar2) && (iVar2 < height * width)) {
    for (iVar3 = 0; iVar3 != iVar5; iVar3 = iVar3 + 1) {
      for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
        if (a_ptr[uVar6] == '\0') {
          y_ptr[uVar6] = (uint8_t)(iVar1 / iVar2);
        }
      }
      a_ptr = a_ptr + a_stride;
      y_ptr = y_ptr + y_stride;
    }
  }
  return (uint)(iVar2 == 0);
}

Assistant:

static int SmoothenBlock(const uint8_t* a_ptr, int a_stride, uint8_t* y_ptr,
                         int y_stride, int width, int height) {
  int sum = 0, count = 0;
  int x, y;
  const uint8_t* alpha_ptr = a_ptr;
  uint8_t* luma_ptr = y_ptr;
  for (y = 0; y < height; ++y) {
    for (x = 0; x < width; ++x) {
      if (alpha_ptr[x] != 0) {
        ++count;
        sum += luma_ptr[x];
      }
    }
    alpha_ptr += a_stride;
    luma_ptr += y_stride;
  }
  if (count > 0 && count < width * height) {
    const uint8_t avg_u8 = (uint8_t)(sum / count);
    alpha_ptr = a_ptr;
    luma_ptr = y_ptr;
    for (y = 0; y < height; ++y) {
      for (x = 0; x < width; ++x) {
        if (alpha_ptr[x] == 0) luma_ptr[x] = avg_u8;
      }
      alpha_ptr += a_stride;
      luma_ptr += y_stride;
    }
  }
  return (count == 0);
}